

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

bool vera::intersection(Line *_A,Line *_B,vec3 *_p,float _threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec3 da;
  vec3 db;
  vec<3,_float,_(glm::qualifier)0> local_90;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  local_80.field_2 = (_A->m_direction).field_2;
  local_80.field_0 = (_A->m_direction).field_0;
  local_80.field_1 = (_A->m_direction).field_1;
  local_50.field_2 = (_B->m_direction).field_2;
  local_50.field_0 = (_B->m_direction).field_0;
  local_50.field_1 = (_B->m_direction).field_1;
  vVar4 = glm::operator-(_B->m_points,_A->m_points);
  local_60.field_2 = vVar4.field_2;
  local_60._0_8_ = vVar4._0_8_;
  vVar4 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_80,&local_50);
  local_70.field_2 = vVar4.field_2;
  local_70._0_8_ = vVar4._0_8_;
  fVar1 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    (&local_60,&local_70);
  if (ABS(fVar1) <= _threshold) {
    vVar4 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_60,&local_50);
    local_90.field_2 = vVar4.field_2;
    local_90._0_8_ = vVar4._0_8_;
    fVar1 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_90,&local_70);
    fVar2 = glm::detail::compute_length2<3,_float,_(glm::qualifier)0,_false>::call(&local_70);
    fVar1 = fVar1 / fVar2;
    if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
      local_90.field_2.z = fVar1 * local_80.field_2.z;
      local_90.field_1.y = fVar1 * local_80.field_1.y;
      local_90.field_0.x = fVar1 * local_80.field_0.x;
      vVar4 = glm::operator+(_A->m_points,&local_90);
      _p->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar4._0_8_
      ;
      _p->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                    (int)((ulong)vVar4._0_8_ >> 0x20);
      _p->field_2 = vVar4.field_2;
      vVar4 = glm::operator-(_p,_B->m_points);
      local_90.field_2 = vVar4.field_2;
      local_90._0_8_ = vVar4._0_8_;
      fVar1 = glm::detail::compute_length2<3,_float,_(glm::qualifier)0,_false>::call(&local_90);
      vVar4 = glm::operator-(_p,_B->m_points + 1);
      local_40.field_2 = vVar4.field_2;
      local_40._0_8_ = vVar4._0_8_;
      fVar2 = glm::detail::compute_length2<3,_float,_(glm::qualifier)0,_false>::call(&local_40);
      fVar3 = glm::detail::compute_length2<3,_float,_(glm::qualifier)0,_false>::call
                        (&_B->m_direction);
      if (fVar2 + fVar1 <= fVar3 + 0.001) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool intersection(const Line& _A, const Line& _B, glm::vec3& _p, float _threshold ) {
    // Unnormalized direction of the ray
    glm::vec3 da = _A.getDireciton();
    glm::vec3 db = _B.getDireciton();
    glm::vec3 dc = _B[0] - _A[0];
    glm::vec3 cross_da_db = glm::cross(da, db);
    
    // lines are not coplanar
    if ( std::abs( glm::dot(dc, cross_da_db)) > _threshold)
        return false;
        
    // Means we have an intersection
    float s = glm::dot( glm::cross(dc, db),  cross_da_db) / glm::length2( cross_da_db );
    if (s >= 0.0 && s <= 1.0) {
        _p = _A[0] + da * s;
        
        // See if this lies on the segment
        if ( (glm::length2(_p - _B[0]) + glm::length2(_p - _B[1])) <= (glm::length2(_B.getDireciton()) + lengthErrorThreshold) )
            return true;
    }

    return false;
}